

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O3

void glslang::RetargetVariable(char *from,char *to,TSymbolTable *symbolTable)

{
  pointer ppTVar1;
  pool_allocator<char> local_80;
  pool_allocator<char> local_78;
  TString local_70;
  TString local_48;
  
  local_78.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_48,
             from,&local_78);
  local_80.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_70,to
             ,&local_80);
  ppTVar1 = (symbolTable->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  TSymbolTableLevel::retargetSymbol
            (ppTVar1[((long)(symbolTable->table).
                            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) * 0x20000000
                     + -0x100000000 >> 0x20],&local_48,&local_70);
  return;
}

Assistant:

static void RetargetVariable(const char* from, const char* to, TSymbolTable& symbolTable)
{
    symbolTable.retargetSymbol(from, to);
}